

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall llbuild::basic::SerialQueue::sync(SerialQueue *this)

{
  SerialQueueImpl *this_00;
  function<void_()> *in_RSI;
  bool isComplete;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  _Manager_type local_98;
  condition_variable cv;
  __native_type local_58;
  
  this_00 = (SerialQueueImpl *)this->impl;
  std::function<void_()>::function((function<void_()> *)&local_a8,in_RSI);
  if (local_98 != (code *)0x0) {
    std::condition_variable::condition_variable(&cv);
    local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_58._16_8_ = 0;
    local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_58.__align = 0;
    local_58._8_8_ = 0;
    isComplete = false;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x20);
    *(_Any_data **)local_c8._M_unused._0_8_ = &local_a8;
    *(__native_type **)((long)local_c8._M_unused._0_8_ + 8) = &local_58;
    *(bool **)((long)local_c8._M_unused._0_8_ + 0x10) = &isComplete;
    *(condition_variable **)((long)local_c8._M_unused._0_8_ + 0x18) = &cv;
    local_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:111:18)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:111:18)>
               ::_M_manager;
    anon_unknown.dwarf_1c19eb::SerialQueueImpl::addOperation(this_00,(function<void_()> *)&local_c8)
    ;
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&local_c8,(mutex_type *)&local_58.__data);
    while (isComplete == false) {
      std::condition_variable::wait((unique_lock *)&cv);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_c8);
    std::condition_variable::~condition_variable(&cv);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    return;
  }
  __assert_fail("fn",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp"
                ,0x68,"void (anonymous namespace)::SerialQueueImpl::sync(std::function<void ()>)");
}

Assistant:

void SerialQueue::sync(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->sync(fn);
}